

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O0

ares_bool_t ares_sockaddr_to_ares_addr(ares_addr *ares_addr,unsigned_short *port,sockaddr *sockaddr)

{
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined8 uVar1;
  undefined8 uVar2;
  uint16_t uVar25;
  uint16_t uStack_52;
  sockaddr_in6 sockaddr_in6;
  sockaddr_in sockaddr_in;
  sockaddr *sockaddr_local;
  unsigned_short *port_local;
  ares_addr *ares_addr_local;
  undefined6 uVar5;
  undefined6 uVar6;
  undefined5 uVar9;
  undefined5 uVar10;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined3 uVar17;
  undefined3 uVar18;
  undefined2 uVar21;
  undefined2 uVar22;
  
  if (sockaddr->sa_family == 2) {
    uVar3 = sockaddr->sa_data[0];
    uVar7 = sockaddr->sa_data[1];
    uVar11 = sockaddr->sa_data[2];
    uVar15 = sockaddr->sa_data[3];
    uVar19 = sockaddr->sa_data[4];
    uVar23 = sockaddr->sa_data[5];
    uVar21 = CONCAT11(uVar23,uVar19);
    uVar17 = CONCAT21(uVar21,uVar15);
    uVar13 = CONCAT31(uVar17,uVar11);
    uVar9 = CONCAT41(uVar13,uVar7);
    uVar5 = CONCAT51(uVar9,uVar3);
    ares_addr->family = 2;
    (ares_addr->addr).addr4.s_addr = uVar13;
    if (port != (unsigned_short *)0x0) {
      sockaddr_in6.sin6_addr.__in6_u.__u6_addr16[7] = (uint16_t)uVar5;
      uVar25 = ntohs(sockaddr_in6.sin6_addr.__in6_u.__u6_addr16[7]);
      *port = uVar25;
    }
    ares_addr_local._4_4_ = ARES_TRUE;
  }
  else if (sockaddr->sa_family == 10) {
    uVar4 = sockaddr->sa_data[0];
    uVar8 = sockaddr->sa_data[1];
    uVar12 = sockaddr->sa_data[2];
    uVar16 = sockaddr->sa_data[3];
    uVar20 = sockaddr->sa_data[4];
    uVar24 = sockaddr->sa_data[5];
    uVar22 = CONCAT11(uVar24,uVar20);
    uVar18 = CONCAT21(uVar22,uVar16);
    uVar14 = CONCAT31(uVar18,uVar12);
    uVar10 = CONCAT41(uVar14,uVar8);
    uVar6 = CONCAT51(uVar10,uVar4);
    uVar1 = *(undefined8 *)(sockaddr->sa_data + 6);
    uVar2 = *(undefined8 *)(sockaddr + 1);
    ares_addr->family = 10;
    *(undefined8 *)&ares_addr->addr = uVar1;
    *(undefined8 *)((long)&ares_addr->addr + 8) = uVar2;
    if (port != (unsigned_short *)0x0) {
      uStack_52 = (uint16_t)uVar6;
      uVar25 = ntohs(uStack_52);
      *port = uVar25;
    }
    ares_addr_local._4_4_ = ARES_TRUE;
  }
  else {
    ares_addr_local._4_4_ = ARES_FALSE;
  }
  return ares_addr_local._4_4_;
}

Assistant:

ares_bool_t ares_sockaddr_to_ares_addr(struct ares_addr      *ares_addr,
                                       unsigned short        *port,
                                       const struct sockaddr *sockaddr)
{
  if (sockaddr->sa_family == AF_INET) {
    /* NOTE: memcpy sockaddr_in due to alignment issues found by UBSAN due to
     *       dnsinfo packing on MacOS */
    struct sockaddr_in sockaddr_in;
    memcpy(&sockaddr_in, sockaddr, sizeof(sockaddr_in));

    ares_addr->family = AF_INET;
    memcpy(&ares_addr->addr.addr4, &(sockaddr_in.sin_addr),
           sizeof(ares_addr->addr.addr4));

    if (port) {
      *port = ntohs(sockaddr_in.sin_port);
    }
    return ARES_TRUE;
  }

  if (sockaddr->sa_family == AF_INET6) {
    /* NOTE: memcpy sockaddr_in6 due to alignment issues found by UBSAN due to
     *       dnsinfo packing on MacOS */
    struct sockaddr_in6 sockaddr_in6;
    memcpy(&sockaddr_in6, sockaddr, sizeof(sockaddr_in6));

    ares_addr->family = AF_INET6;
    memcpy(&ares_addr->addr.addr6, &(sockaddr_in6.sin6_addr),
           sizeof(ares_addr->addr.addr6));
    if (port) {
      *port = ntohs(sockaddr_in6.sin6_port);
    }
    return ARES_TRUE;
  }

  return ARES_FALSE;
}